

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)

{
  long *in_RDI;
  SUNMemoryHelper hclone;
  SUNContext in_stack_ffffffffffffffe8;
  SUNMemoryHelper local_8;
  
  if (*(long *)(in_RDI[1] + 0x20) == 0) {
    if (*in_RDI == 0) {
      local_8 = SUNMemoryHelper_NewEmpty(in_stack_ffffffffffffffe8);
      if (local_8 != (SUNMemoryHelper)0x0) {
        SUNMemoryHelper_CopyOps(local_8,(SUNMemoryHelper)0x1168126);
      }
    }
    else {
      local_8 = (SUNMemoryHelper)0x0;
    }
  }
  else {
    local_8 = (SUNMemoryHelper)(**(code **)(in_RDI[1] + 0x20))(in_RDI);
  }
  return local_8;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)
{
  if (helper->ops->clone == NULL)
  {
    if (helper->content != NULL)
    {
      return(NULL);
    }
    else
    {
      SUNMemoryHelper hclone = SUNMemoryHelper_NewEmpty(helper->sunctx);
      if (hclone) SUNMemoryHelper_CopyOps(helper, hclone);
      return(hclone);
    }
  }
  else
  {
    return(helper->ops->clone(helper));
  }
}